

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_encode_memory
               (uchar **out,size_t *outsize,uchar *image,uint w,uint h,LodePNGColorType colortype,
               uint bitdepth)

{
  uint uVar1;
  undefined1 local_1c0 [184];
  undefined1 local_108 [56];
  undefined1 auStack_d0 [20];
  undefined1 local_bc [44];
  undefined1 auStack_90 [20];
  uint local_64;
  undefined1 local_50 [16];
  undefined1 auStack_40 [16];
  undefined1 auStack_30 [16];
  uint local_20;
  
  local_1c0._0_8_ = &PTR__LodePNGState_02eeb150;
  local_1c0._8_4_ = 0;
  local_1c0._16_8_ =
       (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGDecompressSettings_ptr *)0x0;
  local_1c0._24_4_ = 0;
  local_1c0._28_4_ = 0;
  local_1c0._32_4_ = 0;
  local_1c0._36_8_ = 0;
  local_1c0._44_4_ = 1;
  local_1c0._48_4_ = 1;
  local_1c0._52_4_ = 0;
  local_1c0._56_4_ = 2;
  local_1c0._60_4_ = 1;
  local_1c0._64_4_ = 0x800;
  local_1c0._68_4_ = 3;
  local_1c0._72_4_ = 0x80;
  local_1c0._76_4_ = 1;
  local_1c0._80_8_ =
       (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0;
  local_1c0._88_8_ =
       (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0;
  local_1c0._96_8_ = (void *)0x0;
  local_1c0._112_4_ = LFS_MINSUM;
  local_1c0._104_4_ = 1;
  local_1c0._108_4_ = 1;
  local_1c0._120_8_ = (uchar *)0x0;
  local_1c0._128_4_ = 0;
  local_1c0._132_4_ = 0;
  local_1c0._136_4_ = 1;
  local_1c0._152_32_ = ZEXT432(0) << 0x40;
  local_108._8_4_ = 0;
  local_108._0_4_ = 0;
  local_108._4_4_ = 0;
  local_64 = 0;
  local_50 = SUB3216(ZEXT432(0),0) << 0x40;
  auStack_30 = (undefined1  [16])0x0;
  auStack_d0 = SUB6420(ZEXT464(0),0) << 0x20;
  auStack_90 = (undefined1  [20])0x0;
  local_bc = (undefined1  [44])0x0;
  local_20 = 1;
  local_1c0._148_4_ = bitdepth;
  local_108._20_4_ = bitdepth;
  local_1c0._144_4_ = colortype;
  local_108._16_4_ = colortype;
  local_108._24_32_ = local_1c0._152_32_;
  auStack_40 = local_50;
  lodepng_encode(out,outsize,image,w,h,(LodePNGState *)local_1c0);
  uVar1 = local_20;
  lodepng_state_cleanup((LodePNGState *)local_1c0);
  return uVar1;
}

Assistant:

unsigned lodepng_encode_memory(unsigned char** out, size_t* outsize, const unsigned char* image,
                               unsigned w, unsigned h, LodePNGColorType colortype, unsigned bitdepth)
{
  unsigned error;
  LodePNGState state;
  lodepng_state_init(&state);
  state.info_raw.colortype = colortype;
  state.info_raw.bitdepth = bitdepth;
  state.info_png.color.colortype = colortype;
  state.info_png.color.bitdepth = bitdepth;
  lodepng_encode(out, outsize, image, w, h, &state);
  error = state.error;
  lodepng_state_cleanup(&state);
  return error;
}